

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::Data::Reset(Data *this)

{
  DataChunk *pDVar1;
  DataChunk **ppDVar2;
  
  this->currentOffset = 0;
  ppDVar2 = &this->head;
  while (pDVar1 = *ppDVar2, pDVar1 != (DataChunk *)0x0) {
    pDVar1->currentByte = pDVar1->buffer;
    ppDVar2 = &pDVar1->nextChunk;
  }
  this->current = this->head;
  return;
}

Assistant:

void ByteCodeWriter::Data::Reset()
    {
        currentOffset = 0;
        DataChunk* currentChunk = head;
        while (currentChunk)
        {
            // reset to the starting point
            currentChunk->Reset();
            currentChunk = currentChunk->nextChunk;
        }

        current = head;
    }